

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O2

void Io_NtkWriteOne(FILE *pFile,Abc_Ntk_t *pNtk,int fWriteLatches,int fBb2Wb,int fSeq)

{
  void **ppvVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  ProgressBar *p;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  int i;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int local_4c;
  
  fwrite(".inputs",7,1,(FILE *)pFile);
  Io_NtkWritePis(pFile,pNtk,fWriteLatches);
  fputc(10,(FILE *)pFile);
  fwrite(".outputs",8,1,(FILE *)pFile);
  Io_NtkWritePos(pFile,pNtk,fWriteLatches);
  fputc(10,(FILE *)pFile);
  if (pNtk->ntkFunc == ABC_FUNC_BLACKBOX) {
    if (fBb2Wb != 0) {
      Io_NtkWriteConvertedBox(pFile,pNtk,fSeq);
      return;
    }
    fwrite(".blackbox\n",10,1,(FILE *)pFile);
    return;
  }
  Io_WriteTimingInfo(pFile,pNtk);
  if ((fWriteLatches != 0) && (pNtk->nObjCounts[8] != 0)) {
    fputc(10,(FILE *)pFile);
    for (iVar7 = 0; iVar7 < pNtk->vBoxes->nSize; iVar7 = iVar7 + 1) {
      pAVar3 = Abc_NtkBox(pNtk,iVar7);
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
        Io_NtkWriteLatch(pFile,pAVar3);
      }
    }
    fputc(10,(FILE *)pFile);
  }
  if ((0 < pNtk->nObjCounts[10]) || (0 < pNtk->nObjCounts[9])) {
    fputc(10,(FILE *)pFile);
    for (iVar7 = 0; iVar7 < pNtk->vBoxes->nSize; iVar7 = iVar7 + 1) {
      pAVar3 = Abc_NtkBox(pNtk,iVar7);
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 10) {
        Io_NtkWriteSubckt(pFile,pAVar3);
      }
    }
    fputc(10,(FILE *)pFile);
    for (iVar7 = 0; iVar7 < pNtk->vBoxes->nSize; iVar7 = iVar7 + 1) {
      pAVar3 = Abc_NtkBox(pNtk,iVar7);
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 9) {
        Io_NtkWriteSubckt(pFile,pAVar3);
      }
    }
    fputc(10,(FILE *)pFile);
  }
  local_4c = 0;
  if (pNtk->ntkFunc == ABC_FUNC_MAP) {
    local_4c = Mio_LibraryReadGateNameMax((Mio_Library_t *)pNtk->pManFunc);
  }
  p = Extra_ProgressBarStart(_stdout,pNtk->vObjs->nSize);
  iVar7 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar7) {
      Extra_ProgressBarStop(p);
      return;
    }
    pAVar3 = Abc_NtkObj(pNtk,iVar7);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
      if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= iVar7)) {
        Extra_ProgressBarUpdate_int(p,iVar7,(char *)0x0);
      }
      if (pAVar3->pNtk->ntkFunc == ABC_FUNC_MAP) {
        if ((((*(uint *)&pAVar3->field_0x14 & 0xf) == 7) && ((pAVar3->vFanins).nSize == 1)) &&
           ((pAVar3->field_5).pData == (void *)0x0)) {
          fwrite(".barbuf ",8,1,(FILE *)pFile);
          pcVar5 = Abc_ObjName((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray]);
          pcVar6 = Abc_ObjName((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray])
          ;
          fprintf((FILE *)pFile,"%s %s",pcVar5,pcVar6);
          fputc(10,(FILE *)pFile);
        }
        else {
          fwrite(".gate",5,1,(FILE *)pFile);
          iVar2 = Io_NtkWriteNodeGate(pFile,pAVar3,local_4c);
          fputc(10,(FILE *)pFile);
          if (iVar2 != 0) {
            iVar7 = iVar7 + 1;
          }
        }
      }
      else {
        fwrite(".names",6,1,(FILE *)pFile);
        lVar8 = 0;
        iVar10 = 6;
        iVar2 = 0;
        while( true ) {
          ppvVar1 = pAVar3->pNtk->vObjs->pArray;
          if ((pAVar3->vFanins).nSize <= lVar8) break;
          pcVar5 = Abc_ObjName((Abc_Obj_t *)ppvVar1[(pAVar3->vFanins).pArray[lVar8]]);
          sVar4 = strlen(pcVar5);
          iVar9 = (int)sVar4 + 1;
          if (iVar2 == 0) {
LAB_002e889d:
            iVar2 = 0;
          }
          else if (0x4b < iVar10 + iVar9) {
            fwrite(" \\\n",3,1,(FILE *)pFile);
            iVar10 = 0;
            goto LAB_002e889d;
          }
          fprintf((FILE *)pFile," %s",pcVar5);
          iVar10 = iVar10 + iVar9;
          iVar2 = iVar2 + 1;
          lVar8 = lVar8 + 1;
        }
        pcVar5 = Abc_ObjName((Abc_Obj_t *)ppvVar1[*(pAVar3->vFanouts).pArray]);
        if (iVar2 != 0) {
          sVar4 = strlen(pcVar5);
          if (0x4b < (int)sVar4 + iVar10 + 1) {
            fwrite(" \\\n",3,1,(FILE *)pFile);
          }
        }
        fprintf((FILE *)pFile," %s",pcVar5);
        fputc(10,(FILE *)pFile);
        fputs((char *)(pAVar3->field_5).pData,(FILE *)pFile);
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

void Io_NtkWriteOne( FILE * pFile, Abc_Ntk_t * pNtk, int fWriteLatches, int fBb2Wb, int fSeq )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pNode, * pLatch;
    int i, Length;

    // write the PIs
    fprintf( pFile, ".inputs" );
    Io_NtkWritePis( pFile, pNtk, fWriteLatches );
    fprintf( pFile, "\n" );

    // write the POs
    fprintf( pFile, ".outputs" );
    Io_NtkWritePos( pFile, pNtk, fWriteLatches );
    fprintf( pFile, "\n" );

    // write the blackbox
    if ( Abc_NtkHasBlackbox( pNtk ) )
    {
        if ( fBb2Wb )
            Io_NtkWriteConvertedBox( pFile, pNtk, fSeq );
        else
            fprintf( pFile, ".blackbox\n" );
        return;
    }

    // write the timing info
    Io_WriteTimingInfo( pFile, pNtk );

    // write the latches
    if ( fWriteLatches && !Abc_NtkIsComb(pNtk) )
    {
        fprintf( pFile, "\n" );
        Abc_NtkForEachLatch( pNtk, pLatch, i )
            Io_NtkWriteLatch( pFile, pLatch );
        fprintf( pFile, "\n" );
    }

    // write the subcircuits
//    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    if ( Abc_NtkBlackboxNum(pNtk) > 0 || Abc_NtkWhiteboxNum(pNtk) > 0 )
    {
        fprintf( pFile, "\n" );
        Abc_NtkForEachBlackbox( pNtk, pNode, i )
            Io_NtkWriteSubckt( pFile, pNode );
        fprintf( pFile, "\n" );
        Abc_NtkForEachWhitebox( pNtk, pNode, i )
            Io_NtkWriteSubckt( pFile, pNode );
        fprintf( pFile, "\n" );
    }

    // write each internal node
    Length = Abc_NtkHasMapping(pNtk)? Mio_LibraryReadGateNameMax((Mio_Library_t *)pNtk->pManFunc) : 0;
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        if ( Io_NtkWriteNode( pFile, pNode, Length ) ) // skip the next node
            i++;
    }
    Extra_ProgressBarStop( pProgress );
}